

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O0

void __thiscall Network::add(Network *this,Synapse *n_synapse)

{
  bool bVar1;
  value_type *in_RDI;
  Population *unaff_retaddr;
  
  std::vector<Synapse_*,_std::allocator<Synapse_*>_>::push_back
            ((vector<Synapse_*,_std::allocator<Synapse_*>_> *)unaff_retaddr,(value_type *)in_RDI);
  bVar1 = networkContainsPopulation((Network *)n_synapse,unaff_retaddr);
  if (!bVar1) {
    std::vector<Population_*,_std::allocator<Population_*>_>::push_back
              ((vector<Population_*,_std::allocator<Population_*>_> *)unaff_retaddr,in_RDI);
  }
  bVar1 = networkContainsPopulation((Network *)n_synapse,unaff_retaddr);
  if (!bVar1) {
    std::vector<Population_*,_std::allocator<Population_*>_>::push_back
              ((vector<Population_*,_std::allocator<Population_*>_> *)unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

void Network::add(Synapse* n_synapse) {
    synapses.push_back(n_synapse);
    if(!networkContainsPopulation(n_synapse->from_population))
        populations.push_back(n_synapse->from_population);
    if(!networkContainsPopulation(n_synapse->to_population))
        populations.push_back(n_synapse->to_population);
}